

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O2

char * sx_replacechar(char *dest,int dest_sz,char *src,char find,char replace)

{
  char cVar1;
  
  if (1 < dest_sz) {
    for (; cVar1 = *src, cVar1 != '\0'; src = src + 1) {
      if (cVar1 == find) {
        cVar1 = replace;
      }
      *dest = cVar1;
    }
  }
  *dest = '\0';
  return dest;
}

Assistant:

char* sx_replacechar(char* dest, int dest_sz, const char* src, const char find, const char replace)
{
    int dest_max = dest_sz - 1;
    int offset = 0;
    while (*src && offset < dest_max) {
        if (*src != find)
            dest[offset] = *src;
        else
            dest[offset] = replace;
        ++src;
    }
    dest[offset] = '\0';
    return dest;
}